

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_negative_int<long>(string *text,long *value_p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  byte *pbVar5;
  long *in_RSI;
  int digit;
  uchar c;
  char *end;
  char *start;
  long vmin_over_base;
  long vmin;
  long value;
  int base;
  byte *local_40;
  long local_38;
  long local_28;
  
  local_28 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
  local_38 = SUB168((auVar1 << 0x40 | ZEXT816(0x8000000000000000)) / SEXT816(10),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
  if (0 < SUB168((auVar2 << 0x40 | ZEXT816(0x8000000000000000)) % SEXT816(10),0)) {
    local_38 = local_38 + 1;
  }
  local_40 = (byte *)std::__cxx11::string::data();
  lVar4 = std::__cxx11::string::size();
  pbVar5 = local_40 + lVar4;
  while( true ) {
    if (pbVar5 <= local_40) {
      *in_RSI = local_28;
      return true;
    }
    iVar3 = *local_40 - 0x30;
    if ((9 < iVar3) || (iVar3 < 0)) {
      *in_RSI = local_28;
      return false;
    }
    if (local_28 < local_38) {
      *in_RSI = -0x8000000000000000;
      return false;
    }
    if (local_28 * 10 < (long)iVar3 + -0x8000000000000000) break;
    local_28 = local_28 * 10 - (long)iVar3;
    local_40 = local_40 + 1;
  }
  *in_RSI = -0x8000000000000000;
  return false;
}

Assistant:

bool safe_parse_negative_int(const std::string &text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmin = std::numeric_limits<IntType>::min();
  assert(vmin < 0);
  assert(vmin <= 0 - base);
  IntType vmin_over_base = vmin / base;
  // 2003 c++ standard [expr.mul]
  // "... the sign of the remainder is implementation-defined."
  // Although (vmin/base)*base + vmin%base is always vmin.
  // 2011 c++ standard tightens the spec but we cannot rely on it.
  if (vmin % base > 0) {
    vmin_over_base += 1;
  }
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value < vmin_over_base) {
      *value_p = vmin;
      return false;
    }
    value *= base;
    if (value < vmin + digit) {
      *value_p = vmin;
      return false;
    }
    value -= digit;
  }
  *value_p = value;
  return true;
}